

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall
QtMWidgets::TableViewSection::insertCell(TableViewSection *this,int index,TableViewCell *cell)

{
  long lVar1;
  TableViewCell *this_00;
  int iVar2;
  int iVar3;
  TableViewCell *local_30;
  
  if (-1 < index && cell != (TableViewCell *)0x0) {
    lVar1 = (((this->d).d)->cells).d.size;
    iVar2 = (int)lVar1;
    if (lVar1 < (long)(ulong)(uint)index) {
      index = iVar2;
    }
    iVar2 = iVar2 + index;
    iVar3 = 1;
    if (index != 0) {
      this_00 = (TableViewCell *)operator_new(0x28);
      RowsSeparator::RowsSeparator((RowsSeparator *)this_00,&this->super_QWidget);
      QBoxLayout::insertWidget(((this->d).d)->layout,iVar2,this_00,0,0);
      local_30 = this_00;
      QtPrivate::QPodArrayOps<QtMWidgets::RowsSeparator*>::emplace<QtMWidgets::RowsSeparator*&>
                ((QPodArrayOps<QtMWidgets::RowsSeparator*> *)&((this->d).d)->separators,
                 (long)(index + -1),(RowsSeparator **)&local_30);
      QWidget::show();
      iVar3 = iVar2 + 1;
    }
    if (*(TableViewSection **)(*(long *)&cell->field_0x8 + 0x10) != this) {
      QWidget::setParent(&cell->super_QWidget);
    }
    QBoxLayout::insertWidget(((this->d).d)->layout,iVar3,cell,0,0);
    local_30 = cell;
    QtPrivate::QPodArrayOps<QtMWidgets::TableViewCell*>::emplace<QtMWidgets::TableViewCell*&>
              ((QPodArrayOps<QtMWidgets::TableViewCell*> *)&((this->d).d)->cells,(long)index,
               &local_30);
    ((cell->d).d)->highlightOnClick = ((this->d).d)->highlightCellOnClick;
    QWidget::show();
  }
  return;
}

Assistant:

void
TableViewSection::insertCell( int index, TableViewCell * cell )
{
	if( !cell || index < 0 )
		return;

	if( index > d->cells.size() )
		index = d->cells.size();

	int actualIndex = ( index == 0 ? 1 : index + d->cells.size() );

	if( index != 0 )
	{
		RowsSeparator * s = new RowsSeparator( this );
		d->layout->insertWidget( actualIndex, s );
		d->separators.insert( index - 1, s );
		s->show();
		++actualIndex;
	}

	if( cell->parent() != this )
		cell->setParent( this );
	d->layout->insertWidget( actualIndex, cell );
	d->cells.insert( index, cell );
	cell->setHighlightOnClick( d->highlightCellOnClick );
	cell->show();
}